

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall REPL::loop(REPL *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  reference this_00;
  reference pvVar4;
  istream *piVar5;
  ostream *poVar6;
  char *ctx;
  Position local_224;
  Position local_21c;
  Position pos_2;
  Position local_20c;
  Position pos_1;
  char temp_1;
  int y_1;
  int x_1;
  Position pos;
  int iStack_1e8;
  char temp;
  int z;
  int y;
  int x;
  string command;
  istringstream local_1c0 [8];
  istringstream ss;
  int local_40;
  string local_30 [8];
  string buffer;
  REPL *this_local;
  
  do {
    std::__cxx11::string::string(local_30);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::istringstream::istringstream(local_1c0,local_30,8);
      std::__cxx11::string::string((string *)&y);
      std::operator>>((istream *)local_1c0,(string *)&y);
      ctx = "START";
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &y,"START");
      if (bVar1) {
        AI::init(&this->ai,(EVP_PKEY_CTX *)ctx);
LAB_00102e28:
        local_40 = 0;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&y,"PLACE");
        if (bVar1) {
          piVar5 = std::operator>>((istream *)local_1c0,(char *)((long)&pos.x + 3));
          piVar5 = (istream *)std::istream::operator>>(piVar5,&stack0xfffffffffffffe18);
          std::istream::operator>>(piVar5,&pos.y);
          iVar2 = pos.y;
          z = pos.x._3_1_ + -0x61;
          iStack_1e8 = iStack_1e8 + -1;
          this_00 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[](&this->board,(long)iStack_1e8);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)z);
          *pvVar4 = iVar2;
          goto LAB_00102e28;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&y,"DONE");
        if (bVar1) {
          poVar6 = std::operator<<((ostream *)&std::cout,"OK");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          goto LAB_00102e28;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&y,"BEGIN");
        if (bVar1) {
          _y_1 = AI::begin(&this->ai);
          AI::putChess(&this->ai,y_1,x_1,1);
          poVar6 = operator<<((ostream *)&std::cout,(Position *)&y_1);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          goto LAB_00102e28;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&y,"TURN");
        if (bVar1) {
          piVar5 = std::operator>>((istream *)local_1c0,(char *)((long)&pos_1.x + 3));
          std::istream::operator>>(piVar5,&pos_1.y);
          iVar2 = (int)pos_1.x._3_1_;
          pos_1.y = pos_1.y + -1;
          bVar1 = AI::putChess(&this->ai,pos_1.y,iVar2 + -0x61,2);
          if (bVar1) {
            pos_2.y = pos_1.y;
            pos_2.x = iVar2 + -0x61;
            local_20c = AI::turn(&this->ai,&pos_2);
            if (local_20c.x < 0) {
              poVar6 = std::operator<<((ostream *)&std::cout,"PASS");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            }
            else {
              AI::putChess(&this->ai,local_20c.x,local_20c.y,1);
              poVar6 = operator<<((ostream *)&std::cout,&local_20c);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cout,"input error");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
          goto LAB_00102e28;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&y,"PASS");
        if (bVar1) {
          local_224.x = 0;
          local_224.y = 0;
          local_21c = AI::turn(&this->ai,&local_224);
          if (local_21c.x < 0) {
            poVar6 = std::operator<<((ostream *)&std::cout,"PASS");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
          else {
            AI::putChess(&this->ai,local_21c.x,local_21c.y,1);
            poVar6 = operator<<((ostream *)&std::cout,&local_21c);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
          goto LAB_00102e28;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&y,"END");
        if (!bVar1) goto LAB_00102e28;
        local_40 = 3;
      }
      std::__cxx11::string::~string((string *)&y);
      std::__cxx11::istringstream::~istringstream(local_1c0);
    }
    else {
      local_40 = 2;
    }
    std::__cxx11::string::~string(local_30);
    if ((local_40 != 0) && (local_40 != 2)) {
      return;
    }
  } while( true );
}

Assistant:

void REPL::loop() {
    while (true) {
        string buffer;
        getline(cin, buffer);
        if (buffer.empty()) continue;
        istringstream ss(buffer);

        string command;
        ss >> command;
        if (command == START) {
            ai.init();
        } else if (command == PLACE) {
            int x, y, z;
            char temp;
            ss >> temp >> y >> z;
            x = temp - 'a';
            --y;
            board[y][x] = z;
        } else if (command == DONE) {
            cout << "OK" << endl;
        } else if (command == BEGIN) {
            Position pos = ai.begin();
            ai.putChess(pos.x, pos.y, ME);
            cout << pos << endl;
        } else if (command == TURN) {
            int x, y;
            char temp;
            ss >> temp >> y;
            x = temp - 'a';
            --y;
            if (ai.putChess(y, x, OTHER)) {
                Position pos = ai.turn({x, y});
                if (pos.x >= 0) {
                    ai.putChess(pos.x, pos.y, ME);
                    cout << pos << endl;
                } else {
                    cout << PASS << endl;
                }
            } else {
                cout << "input error" << endl;
            }
        } else if (command == PASS) {
            Position pos = ai.turn({0, 0});
            if (pos.x >= 0) {
                ai.putChess(pos.x, pos.y, ME);
                cout << pos << endl;
            } else {
                cout << PASS << endl;
            }
        } else if (command == END) {
            break;
        }
        //printBoard();
    }
}